

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Match.cpp
# Opt level: O0

void __thiscall xercesc_4_0::Match::setNoGroups(Match *this,int n)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int local_18;
  int i;
  int n_local;
  Match *this_local;
  
  if ((this->fNoGroups < 1) || (this->fPositionsSize < n)) {
    cleanUp(this);
    this->fPositionsSize = n;
    iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,(long)n << 2);
    this->fStartPositions = (int *)CONCAT44(extraout_var,iVar1);
    iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,(long)n << 2);
    this->fEndPositions = (int *)CONCAT44(extraout_var_00,iVar1);
  }
  this->fNoGroups = n;
  for (local_18 = 0; local_18 < this->fPositionsSize; local_18 = local_18 + 1) {
    this->fStartPositions[local_18] = -1;
    this->fEndPositions[local_18] = -1;
  }
  return;
}

Assistant:

void Match::setNoGroups(const int n) {

    if (fNoGroups <= 0 || fPositionsSize < n) {

        cleanUp();
        fPositionsSize = n;
        fStartPositions = (int*) fMemoryManager->allocate(n * sizeof(int));//new int[n];
        fEndPositions = (int*) fMemoryManager->allocate(n * sizeof(int));//new int[n];
    }

    fNoGroups = n;

    for (int i=0; i< fPositionsSize; i++) {

        fStartPositions[i] = -1;
        fEndPositions[i] = -1;
    }
}